

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  Master *master_00;
  DivisionsVector *divisions_;
  size_type sVar8;
  reference pvVar9;
  undefined8 *in_RSI;
  RegularMergePartners merge_partners;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  BlockID neighbor;
  Link *link;
  int gid;
  size_t i;
  vector<int,_std::allocator<int>_> gids;
  ContiguousAssigner assigner;
  Master master;
  FileStorage storage;
  Options ops;
  string log_level;
  int nblocks;
  communicator world;
  environment env;
  string *in_stack_ffffffffffffe2a8;
  BlockID *block;
  RegularDecomposer<diy::Bounds<int>_> *decomposer_00;
  Master *in_stack_ffffffffffffe2b0;
  MemoryManagement *this;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffe2b8;
  Assigner *assigner_00;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffe2c0;
  ContiguousAssigner *in_stack_ffffffffffffe2c8;
  pointer pbVar10;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe2d0;
  pointer pbVar11;
  int in_stack_ffffffffffffe2dc;
  allocator<char> *in_stack_ffffffffffffe2e0;
  char (*in_stack_ffffffffffffe2e8) [28];
  undefined4 in_stack_ffffffffffffe2f0;
  undefined4 in_stack_ffffffffffffe2f4;
  Options *in_stack_ffffffffffffe2f8;
  FileStorage *in_stack_ffffffffffffe300;
  FileStorage *this_00;
  undefined4 in_stack_ffffffffffffe308;
  string *in_stack_ffffffffffffe310;
  BoolVector *share_face_;
  undefined4 in_stack_ffffffffffffe318;
  value_type in_stack_ffffffffffffe31c;
  Bounds *in_stack_ffffffffffffe320;
  int in_stack_ffffffffffffe32c;
  Master *in_stack_ffffffffffffe330;
  undefined4 in_stack_ffffffffffffe350;
  pointer local_1bf8;
  pointer pbStack_1bf0;
  pointer local_1be8;
  undefined1 local_1bd8 [16];
  _Invoker_type local_1bc8;
  undefined1 local_1bb8 [48];
  _Base_ptr local_1b88;
  _Base_ptr p_Stack_1b80;
  _Any_data local_1b78;
  _Manager_type local_1b68;
  int local_19cc;
  BoolVector local_19c8;
  size_t sStack_19a0;
  __node_base_ptr local_1998;
  __buckets_ptr pp_Stack_1990;
  size_type local_1988;
  __node_base _Stack_1980;
  size_type local_1978;
  _Prime_rehash_policy _Stack_1970;
  code *local_1960;
  int local_1958;
  int local_1954;
  Master *local_1950;
  value_type local_1944;
  ulong local_1940;
  vector<int,_std::allocator<int>_> local_1938;
  code *local_1910;
  Assigner local_1908 [2];
  code *local_18e8;
  code *local_18c0;
  code *local_1898;
  char **in_stack_ffffffffffffe770;
  int in_stack_ffffffffffffe77c;
  Options *in_stack_ffffffffffffe780;
  communicator local_1870 [237];
  allocator<char> local_221;
  string local_220 [32];
  BlockID local_200 [16];
  string local_180 [48];
  undefined4 local_150;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [47];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [103];
  allocator<char> local_61;
  string local_60 [32];
  int local_40;
  communicator local_30;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe2b0,
             (int)((ulong)in_stack_ffffffffffffe2a8 >> 0x20),(char **)0x1127bd);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe2b0);
  local_40 = diy::mpi::communicator::size(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             *in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
  std::allocator<char>::~allocator(&local_61);
  opts::Options::Options((Options *)in_stack_ffffffffffffe2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             *in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             *in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
  opts::Option<int>((char)((uint)in_stack_ffffffffffffe32c >> 0x18),
                    (string *)in_stack_ffffffffffffe320,
                    (int *)CONCAT44(in_stack_ffffffffffffe31c,in_stack_ffffffffffffe318),
                    in_stack_ffffffffffffe310);
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffe2b0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             *in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             *in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
  opts::Option<std::__cxx11::string>
            ((char)((uint)in_stack_ffffffffffffe32c >> 0x18),(string *)in_stack_ffffffffffffe320,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe31c,in_stack_ffffffffffffe318),in_stack_ffffffffffffe310
            );
  opts::Options::operator>>
            ((Options *)in_stack_ffffffffffffe2b0,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe2a8);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe2b0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe2b0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  bVar2 = opts::Options::parse
                    (in_stack_ffffffffffffe780,in_stack_ffffffffffffe77c,in_stack_ffffffffffffe770);
  if (bVar2) {
    std::__cxx11::string::string(local_180,local_60);
    diy::create_logger(in_stack_ffffffffffffe2a8);
    std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x112d08);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
               *in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
    diy::FileStorage::FileStorage(in_stack_ffffffffffffe300,(string *)in_stack_ffffffffffffe2f8);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    diy::mpi::communicator::communicator(local_1870,&local_30);
    local_1898 = create_block;
    std::function<void*()>::function<void*(*)(),void>
              ((function<void_*()> *)in_stack_ffffffffffffe2c0,
               (_func_void_ptr **)in_stack_ffffffffffffe2b8);
    local_18c0 = destroy_block;
    std::function<void(void*)>::function<void(*)(void*),void>
              ((function<void_(void_*)> *)in_stack_ffffffffffffe2c0,
               (_func_void_void_ptr **)in_stack_ffffffffffffe2b8);
    local_18e8 = save_block;
    std::function<void(void_const*,diy::BinaryBuffer&)>::
    function<void(*)(void_const*,diy::BinaryBuffer&),void>
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe2c0,
               in_stack_ffffffffffffe2b8);
    local_1910 = load_block;
    std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
              (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
    master_00 = (Master *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy
              ((QueueSizePolicy *)in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8);
    assigner_00 = local_1908;
    this = (MemoryManagement *)&stack0xffffffffffffe720;
    block = local_200;
    diy::Master::Master((Master *)master.mt_gen._M_x[0x75],(communicator *)master.mt_gen._M_x[0x74],
                        master.mt_gen._M_x[0x73]._4_4_,(int)master.mt_gen._M_x[0x73],
                        (CreateBlock *)master.mt_gen._M_x[0x72],
                        (DestroyBlock *)master.mt_gen._M_x[0x71],
                        (ExternalStorage *)master.mt_gen._M_x[0x77],
                        (SaveBlock *)master.mt_gen._M_x[0x78],(LoadBlock *)master.mt_gen._M_x[0x79],
                        (QueuePolicy *)master.mt_gen._M_x[0x7a]);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x112eb8);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x112ec5);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x112ed2);
    std::function<void_*()>::~function((function<void_*()> *)0x112edf);
    diy::mpi::communicator::~communicator((communicator *)0x112eec);
    divisions_ = (DivisionsVector *)time((time_t *)0x0);
    iVar3 = diy::mpi::communicator::rank(&local_30);
    srand((int)divisions_ + iVar3);
    iVar4 = diy::mpi::communicator::size(&local_30);
    diy::ContiguousAssigner::Assigner
              ((ContiguousAssigner *)this,(int)((ulong)block >> 0x20),(int)block);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x112f6b);
    iVar5 = diy::mpi::communicator::rank(&local_30);
    diy::ContiguousAssigner::local_gids
              ((ContiguousAssigner *)in_stack_ffffffffffffe2e0,in_stack_ffffffffffffe2dc,
               in_stack_ffffffffffffe2d0);
    local_1940 = 0;
    while( true ) {
      uVar1 = local_1940;
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_1938);
      if (sVar8 <= uVar1) break;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_1938,local_1940);
      local_1944 = *pvVar9;
      in_stack_ffffffffffffe330 = (Master *)operator_new(0x20);
      diy::Link::Link((Link *)this);
      local_1950 = in_stack_ffffffffffffe330;
      if (local_1944 < local_40 + -1) {
        local_1958 = local_1944 + 1;
        in_stack_ffffffffffffe32c =
             diy::ContiguousAssigner::rank
                       (in_stack_ffffffffffffe2c8,(int)((ulong)master_00 >> 0x20));
        local_1954 = in_stack_ffffffffffffe32c;
        diy::Link::add_neighbor((Link *)this,block);
      }
      if (0 < local_1944) {
        local_1958 = local_1944 + -1;
        local_1954 = diy::ContiguousAssigner::rank
                               (in_stack_ffffffffffffe2c8,(int)((ulong)master_00 >> 0x20));
        diy::Link::add_neighbor((Link *)this,block);
      }
      in_stack_ffffffffffffe31c = local_1944;
      in_stack_ffffffffffffe320 = (Bounds *)operator_new(0x14);
      iVar6 = rand();
      Block::Block((Block *)in_stack_ffffffffffffe320,iVar6 + 1 + (iVar6 / 10) * -10);
      diy::Master::add(in_stack_ffffffffffffe330,in_stack_ffffffffffffe32c,in_stack_ffffffffffffe320
                       ,(Link *)CONCAT44(in_stack_ffffffffffffe31c,in_stack_ffffffffffffe318));
      local_1940 = local_1940 + 1;
    }
    local_1960 = bounce;
    local_1978 = 0;
    _Stack_1970._M_max_load_factor = 0.0;
    _Stack_1970._4_4_ = 0;
    local_1988 = 0;
    _Stack_1980._M_nxt = (_Hash_node_base *)0x0;
    local_1998 = (__node_base_ptr)0x0;
    pp_Stack_1990 = (__buckets_ptr)0x0;
    local_19c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    sStack_19a0 = 0;
    local_19c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_19c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._8_8_ = 0;
    local_19c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_19c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 0;
    share_face_ = &local_19c8;
    diy::MemoryManagement::MemoryManagement(this);
    diy::Master::iexchange<bool(*)(Block*,diy::Master::ProxyWithLink_const&)>
              ((Master *)CONCAT44(iVar3,in_stack_ffffffffffffe350),
               (_func_bool_Block_ptr_ProxyWithLink_ptr **)divisions_,
               (MemoryManagement *)CONCAT44(iVar4,iVar5));
    diy::MemoryManagement::~MemoryManagement(this);
    iVar3 = diy::mpi::communicator::rank(&local_30);
    local_19cc = iVar3;
    fmt::v7::print<char[28],int,char>(in_stack_ffffffffffffe2e8,(int *)in_stack_ffffffffffffe2e0);
    diy::interval((int)((ulong)in_stack_ffffffffffffe2e8 >> 0x20),(int)in_stack_ffffffffffffe2e8);
    pbVar10 = (pointer)0x0;
    pbVar11 = (pointer)0x0;
    local_1b78._M_unused._M_object = (_Base_ptr)0x0;
    local_1b78._8_8_ = 0;
    local_1b88 = (_Base_ptr)0x0;
    p_Stack_1b80 = (_Base_ptr)0x0;
    local_1b68 = (_Manager_type)0x0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x1133fb);
    local_1bb8._32_8_ = (pointer)0x0;
    this_00 = (FileStorage *)local_1bb8;
    local_1bb8._0_8_ = pbVar10;
    local_1bb8._8_8_ = pbVar11;
    local_1bb8._16_8_ = pbVar10;
    local_1bb8._24_8_ = pbVar11;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x11342e);
    local_1bc8 = (_Invoker_type)0x0;
    decomposer_00 = (RegularDecomposer<diy::Bounds<int>_> *)local_1bd8;
    local_1bd8._0_8_ = pbVar10;
    local_1bd8._8_8_ = pbVar11;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x113459);
    local_1be8 = (pointer)0x0;
    in_stack_ffffffffffffe2b0 = (Master *)&local_1bf8;
    local_1bf8 = pbVar10;
    pbStack_1bf0 = pbVar11;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x113484);
    diy::RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
              ((RegularDecomposer<diy::Bounds<int>_> *)in_stack_ffffffffffffe330,
               in_stack_ffffffffffffe32c,in_stack_ffffffffffffe320,in_stack_ffffffffffffe31c,
               share_face_,(BoolVector *)CONCAT44(iVar3,in_stack_ffffffffffffe308),
               (CoordinateVector *)CONCAT44(iVar4,iVar5),divisions_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)master_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)master_00);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1134e9);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1134f6);
    diy::Bounds<int>::~Bounds((Bounds<int> *)in_stack_ffffffffffffe2b0);
    diy::RegularMergePartners::RegularMergePartners<diy::RegularDecomposer<diy::Bounds<int>>>
              ((RegularMergePartners *)in_stack_ffffffffffffe2b0,decomposer_00,0,false);
    diy::reduce<main::__0,diy::RegularMergePartners>
              (master_00,assigner_00,(RegularMergePartners *)in_stack_ffffffffffffe2b0,
               (anon_class_1_0_00000001 *)decomposer_00);
    diy::RegularMergePartners::~RegularMergePartners((RegularMergePartners *)0x113555);
    diy::RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer
              ((RegularDecomposer<diy::Bounds<int>_> *)in_stack_ffffffffffffe2b0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)master_00);
    diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x11357c);
    diy::Master::~Master(in_stack_ffffffffffffe2b0);
    diy::FileStorage::~FileStorage(this_00);
    local_150 = 0;
  }
  else {
    iVar3 = diy::mpi::communicator::rank(&local_30);
    if (iVar3 == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar7 = std::operator<<(poVar7,(char *)*local_10);
      std::operator<<(poVar7," [OPTIONS]\n");
      opts::operator<<((ostream *)in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8);
    }
    local_4 = 1;
    local_150 = 1;
  }
  opts::Options::~Options((Options *)in_stack_ffffffffffffe2b0);
  std::__cxx11::string::~string(local_60);
  diy::mpi::communicator::~communicator((communicator *)0x1135c8);
  diy::mpi::environment::~environment((environment *)0x1135d5);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;

    // get command line arguments
    int         nblocks     = world.size();
    std::string log_level   = "info";
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  nblocks,        "number of blocks")
        >> Option('l', "log",     log_level,      "log level")
    ;
    if (!ops.parse(argc,argv))
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << ops;
        }
        return 1;
    }

    diy::create_logger(log_level);

    diy::FileStorage          storage("./DIY.XXXXXX");

    diy::Master               master(world,
                                     2,
                                     -1,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    srand(static_cast<unsigned int>(time(NULL) + world.rank()));

    diy::ContiguousAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (size_t i = 0; i < gids.size(); ++i)   // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*   link = new diy::Link;   // link is this block's neighborhood
        diy::BlockID neighbor;               // one neighbor in the neighborhood
        if (gid < nblocks - 1)               // all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        master.add(gid, new Block(1 + rand() % 10), link);    // add the current local block to the master
    }

    // dequeue, enqueue, exchange all in one nonblocking routine
    master.iexchange(&bounce);

    // alternatively, can hold small messages to reduce communication frequency
    // TODO: add this option to the test once we decide we will keep it
//     master.iexchange(&bounce, 16, 100);

    fmt::print("[{}]: Checking correctness\n", world.rank());

    // check correctness: number of finished particles and hops matches the expected numbers
    diy::RegularDecomposer<diy::DiscreteBounds> decomposer(1, diy::interval(0, nblocks-1), nblocks);
    diy::RegularMergePartners  merge_partners(decomposer, 2, false);
    diy::reduce(master, assigner, merge_partners,
                [](Block*                           b,
                   const diy::ReduceProxy&          rp,
                   const diy::RegularMergePartners&)
                {
                    fmt::print("[{}]: round = {}, entered\n", rp.gid(), rp.round());

                    // step 1: dequeue
                    for (int i = 0; i < rp.in_link().size(); ++i)
                    {
                        int nbr_gid = rp.in_link().target(i).gid;
                        if (nbr_gid == rp.gid())
                            continue;

                        int ep; rp.dequeue(nbr_gid, ep);    b->expected_particles   += ep;
                        int eh; rp.dequeue(nbr_gid, eh);    b->expected_hops        += eh;
                        int fp; rp.dequeue(nbr_gid, fp);    b->finished_particles   += fp;
                        int fh; rp.dequeue(nbr_gid, fh);    b->finished_hops        += fh;
                    }

                    // step 2: enqueue
                    for (int i = 0; i < rp.out_link().size(); ++i)    // redundant since size should equal to 1
                    {
                        // only send to root of group, but not self
                        if (rp.out_link().target(i).gid != rp.gid())
                        {
                            rp.enqueue(rp.out_link().target(i), b->expected_particles);
                            rp.enqueue(rp.out_link().target(i), b->expected_hops);
                            rp.enqueue(rp.out_link().target(i), b->finished_particles);
                            rp.enqueue(rp.out_link().target(i), b->finished_hops);
                        }
                    }

                    if (rp.out_link().size() == 0 && rp.gid() == 0)     // tip of the reduction, check correctness
                    {
                        fmt::print("[{}]: checking correctness, {} vs {}, {} vs {}\n",
                                   rp.gid(),
                                   b->expected_particles, b->finished_particles,
                                   b->expected_hops, b->finished_hops);

                        if (b->expected_particles != b->finished_particles)
                        {
                           fmt::print(stderr, "In block {}, all_expected_particles != all_finished_particles: {} != {}\n",
                                              rp.gid(), b->expected_particles, b->finished_particles);
                           std::abort();
                        }
                        if (b->expected_hops != b->finished_hops)
                        {
                           fmt::print(stderr, "In block {}, all_expected_hops != all_finished_hops: {} != {}\n",
                                              rp.gid(), b->expected_hops, b->finished_hops);
                           std::abort();
                        }
                    }
                    fmt::print("[{}]: round = {}, leaving\n", rp.gid(), rp.round());
                });
}